

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall CommandDrawString::CommandDrawString(CommandDrawString *this,SBarInfo *script)

{
  SBarInfo *script_local;
  CommandDrawString *this_local;
  
  SBarInfoCommand::SBarInfoCommand(&this->super_SBarInfoCommand,script);
  (this->super_SBarInfoCommand)._vptr_SBarInfoCommand =
       (_func_int **)&PTR__CommandDrawString_00b86288;
  this->lineBreaks = false;
  this->breakWidth = 0x140;
  this->shadow = false;
  this->shadowX = 2;
  this->shadowY = 2;
  this->spacing = 0;
  this->font = (FFont *)0x0;
  this->translation = CR_UNTRANSLATED;
  this->cache = -1;
  this->strValue = CONSTANT;
  this->valueArgument = 0;
  FString::FString(&this->str);
  this->alignment = ALIGN_RIGHT;
  return;
}

Assistant:

CommandDrawString(SBarInfo *script) : SBarInfoCommand(script),
			lineBreaks(false), breakWidth(320), shadow(false), shadowX(2),
			shadowY(2), spacing(0), font(NULL), translation(CR_UNTRANSLATED),
			cache(-1), strValue(CONSTANT), valueArgument(0), alignment(ALIGN_RIGHT)
		{
		}